

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLpUtils.cpp
# Opt level: O2

bool boundScaleOk(vector<double,_std::allocator<double>_> *lower,
                 vector<double,_std::allocator<double>_> *upper,HighsInt bound_scale,
                 double infinite_bound)

{
  double dVar1;
  pointer pdVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  double dVar6;
  
  if (bound_scale != 0) {
    dVar6 = ldexp(1.0,bound_scale);
    pdVar2 = (lower->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar3 = (ulong)((long)(lower->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                          super__Vector_impl_data._M_finish - (long)pdVar2) >> 3;
    uVar5 = 0;
    uVar4 = uVar3 & 0xffffffff;
    if ((int)uVar3 < 1) {
      uVar4 = uVar5;
    }
    while (((uVar4 != uVar5 &&
            ((dVar1 = pdVar2[uVar5], dVar1 == -INFINITY || (ABS(dVar1 * dVar6) <= infinite_bound))))
           && ((dVar1 = (upper->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                        super__Vector_impl_data._M_start[uVar5], dVar1 == INFINITY ||
               (ABS(dVar1 * dVar6) <= infinite_bound))))) {
      uVar5 = uVar5 + 1;
    }
    return uVar4 == uVar5;
  }
  return true;
}

Assistant:

bool boundScaleOk(const vector<double>& lower, const vector<double>& upper,
                  const HighsInt bound_scale, const double infinite_bound) {
  if (!bound_scale) return true;
  double bound_scale_value = std::pow(2, bound_scale);
  for (HighsInt iCol = 0; iCol < HighsInt(lower.size()); iCol++) {
    if (lower[iCol] > -kHighsInf &&
        std::abs(lower[iCol] * bound_scale_value) > infinite_bound)
      return false;
    if (upper[iCol] < kHighsInf &&
        std::abs(upper[iCol] * bound_scale_value) > infinite_bound)
      return false;
  }
  return true;
}